

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerWrite(PgHdr *pPg)

{
  Pager *pPVar1;
  Pager *pPager;
  PgHdr *pPg_local;
  
  pPVar1 = pPg->pPager;
  if (((pPg->flags & 4) == 0) || (pPVar1->dbSize < pPg->pgno)) {
    if (pPVar1->errCode == 0) {
      if ((uint)pPVar1->pageSize < pPVar1->sectorSize) {
        pPg_local._4_4_ = pagerWriteLargeSector(pPg);
      }
      else {
        pPg_local._4_4_ = pager_write(pPg);
      }
    }
    else {
      pPg_local._4_4_ = pPVar1->errCode;
    }
  }
  else if (pPVar1->nSavepoint == 0) {
    pPg_local._4_4_ = 0;
  }
  else {
    pPg_local._4_4_ = subjournalPageIfRequired(pPg);
  }
  return pPg_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}